

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_namespace::run_impl(statement_namespace *this)

{
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  undefined *puVar4;
  domain_type *domain;
  _Elt_pointer ppsVar5;
  _Map_pointer pppsVar6;
  _Elt_pointer ppsVar7;
  scope_guard scope;
  var local_120;
  scope_guard local_118;
  statement_namespace *local_110;
  namespace_t local_108;
  element_type *local_f8;
  undefined1 local_f0 [96];
  domain_type local_90;
  
  local_118.context = &(this->super_statement_base).context;
  peVar1 = (this->super_statement_base).context.
           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8 = (peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  domain_manager::add_domain
            (&(((peVar1->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_runtime_type).storage);
  ppsVar7 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_110 = this;
  if (ppsVar7 != ppsVar2) {
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar6 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar4 = current_process;
      psVar3 = *ppsVar7;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar4 + 0xd0),(void *)0x0);
      }
      (*psVar3->_vptr_statement_base[3])(psVar3);
      ppsVar7 = ppsVar7 + 1;
      if (ppsVar7 == ppsVar5) {
        ppsVar7 = pppsVar6[1];
        pppsVar6 = pppsVar6 + 1;
        ppsVar5 = ppsVar7 + 0x40;
      }
    } while (ppsVar7 != ppsVar2);
  }
  domain = domain_manager::get_domain
                     (&((((((local_118.context)->
                           super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->instance).
                         super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_runtime_type).storage);
  domain_type::domain_type(&local_90,domain);
  scope_guard::~scope_guard(&local_118);
  local_108.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::domain_type>
            (&local_108.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (name_space **)&local_108,(allocator<cs::name_space> *)local_f0,&local_90);
  make_namespace((cs *)&local_120,&local_108);
  domain_manager::add_var_no_return<std::__cxx11::string&>
            (&(local_f8->super_runtime_type).storage,&local_110->mName,&local_120,true);
  cs_impl::any::recycle(&local_120);
  if (local_108.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  domain_type::~domain_type(&local_90);
  return;
}

Assistant:

void statement_namespace::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		context->instance->storage.add_var_no_return(this->mName,
		make_namespace(make_shared_namespace<name_space>([this] {
			scope_guard scope(context);
			for (auto &ptr: mBlock)
			{
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(),
					                ptr->get_raw_code(), e.what());
				}
			}
			return scope.get();
		}())), true);
	}